

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testJacobiEigenSolver.cpp
# Opt level: O3

void testMinMaxEigenValue<Imath_3_2::Matrix44<float>>(Matrix44<float> *A)

{
  uint i;
  long lVar1;
  float (*pafVar2) [4];
  uint j;
  long lVar3;
  float fVar4;
  float fVar5;
  Matrix44<float> V;
  Matrix44<float> U;
  TV maxV;
  TV minV;
  TV S;
  float local_138 [16];
  undefined4 local_f8;
  undefined8 local_f4;
  undefined8 uStack_ec;
  undefined4 local_e4;
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined4 local_d0;
  undefined8 local_cc;
  undefined8 uStack_c4;
  undefined4 local_bc;
  Vec4 local_b8 [16];
  Vec4 local_a8 [16];
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  undefined8 uStack_20;
  
  local_f8 = 0x3f800000;
  local_f4 = 0;
  uStack_ec = 0;
  local_e4 = 0x3f800000;
  local_e0 = 0;
  uStack_d8 = 0;
  local_d0 = 0x3f800000;
  local_cc = 0;
  uStack_c4 = 0;
  local_bc = 0x3f800000;
  local_138[0] = 1.0;
  local_138[1] = 0.0;
  local_138[2] = 0.0;
  local_138[3] = 0.0;
  local_138[4] = 0.0;
  local_138[5] = 1.0;
  local_138[6] = 0.0;
  local_138[7] = 0.0;
  local_138[8] = 0.0;
  local_138[9] = 0.0;
  local_138[10] = 1.0;
  local_138[0xb] = 0.0;
  local_138[0xc] = 0.0;
  local_138[0xd] = 0.0;
  local_138[0xe] = 0.0;
  local_138[0xf] = 1.0;
  fVar4 = 0.0;
  lVar1 = 0;
  pafVar2 = (float (*) [4])A;
  do {
    lVar3 = 0;
    fVar5 = fVar4;
    do {
      fVar4 = ABS((*(float (*) [4])*pafVar2)[lVar3]);
      if (fVar4 <= fVar5) {
        fVar4 = fVar5;
      }
      lVar3 = lVar3 + 1;
      fVar5 = fVar4;
    } while (lVar3 != 4);
    lVar1 = lVar1 + 1;
    pafVar2 = pafVar2 + 1;
  } while (lVar1 != 4);
  fVar5 = 1.1920929e-07;
  if (1.1920929e-07 <= fVar4) {
    fVar5 = fVar4;
  }
  fVar4 = fVar5 * 100.0 * 1.1920929e-07;
  local_58 = *(undefined8 *)A->x[0];
  uStack_50 = *(undefined8 *)(A->x[0] + 2);
  local_48 = *(undefined8 *)A->x[1];
  uStack_40 = *(undefined8 *)(A->x[1] + 2);
  local_38 = *(undefined8 *)A->x[2];
  uStack_30 = *(undefined8 *)(A->x[2] + 2);
  local_28 = *(undefined8 *)A->x[3];
  uStack_20 = *(undefined8 *)(A->x[3] + 2);
  Imath_3_2::minEigenVector<Imath_3_2::Matrix44<float>,Imath_3_2::Vec4<float>>
            ((Matrix44 *)&local_58,local_a8);
  local_98 = *(undefined8 *)A->x[0];
  uStack_90 = *(undefined8 *)(A->x[0] + 2);
  local_88 = *(undefined8 *)A->x[1];
  uStack_80 = *(undefined8 *)(A->x[1] + 2);
  local_78 = *(undefined8 *)A->x[2];
  uStack_70 = *(undefined8 *)(A->x[2] + 2);
  local_68 = *(undefined8 *)A->x[3];
  uStack_60 = *(undefined8 *)(A->x[3] + 2);
  Imath_3_2::maxEigenVector<Imath_3_2::Matrix44<float>,Imath_3_2::Vec4<float>>
            ((Matrix44 *)&local_98,local_b8);
  local_58 = *(undefined8 *)A->x[0];
  uStack_50 = *(undefined8 *)(A->x[0] + 2);
  local_48 = *(undefined8 *)A->x[1];
  uStack_40 = *(undefined8 *)(A->x[1] + 2);
  local_38 = *(undefined8 *)A->x[2];
  uStack_30 = *(undefined8 *)(A->x[2] + 2);
  local_28 = *(undefined8 *)A->x[3];
  uStack_20 = *(undefined8 *)(A->x[3] + 2);
  lVar1 = 0;
  Imath_3_2::jacobiSVD<float>
            ((Matrix44 *)&local_58,(Matrix44 *)&local_f8,(Vec4 *)&local_98,(Matrix44 *)local_138,
             1.1920929e-07,false);
  while( true ) {
    if (fVar4 <= ABS(*(float *)(local_a8 + lVar1) - local_138[lVar1 + 3])) {
      __assert_fail("abs (minV[i] - V[i][dim - 1]) < threshold",
                    "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testJacobiEigenSolver.cpp"
                    ,0x97,"void testMinMaxEigenValue(const TM &) [TM = Imath_3_2::Matrix44<float>]")
      ;
    }
    if (fVar4 <= ABS(*(float *)(local_b8 + lVar1) - local_138[lVar1])) break;
    lVar1 = lVar1 + 4;
    if (lVar1 == 0x10) {
      return;
    }
  }
  __assert_fail("abs (maxV[i] - V[i][0]) < threshold",
                "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testJacobiEigenSolver.cpp"
                ,0x98,"void testMinMaxEigenValue(const TM &) [TM = Imath_3_2::Matrix44<float>]");
}

Assistant:

void
testMinMaxEigenValue (const TM& A)
{
    typedef typename TM::BaseVecType TV;
    typedef typename TM::BaseType    T;

    TV minV, maxV, S;
    TM U, V;

    const T threshold = computeThreshold (A);

    {
        TM A1 (A);
        minEigenVector (A1, minV);
        TM A2 (A);
        maxEigenVector (A2, maxV);
    }
    {
        TM A3 (A);
        jacobiSVD (A3, U, S, V);
    }

    const int dim = TM::dimensions ();

    for (int i = 0; i < dim; ++i)
    {
        assert (abs (minV[i] - V[i][dim - 1]) < threshold);
        assert (abs (maxV[i] - V[i][0]) < threshold);
    }
}